

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Glucose::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  undefined8 in_RAX;
  vec<unsigned_int> *pvVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int i;
  undefined8 uStack_38;
  
  if (this->n_touched != 0) {
    iVar8 = 0;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar2 = (this->subsumption_queue).buf.sz;
      iVar3 = (this->subsumption_queue).first;
      iVar10 = 0;
      if (iVar1 < iVar3) {
        iVar10 = iVar2;
      }
      if ((iVar1 - iVar3) + iVar10 <= iVar8) break;
      uVar4 = (this->subsumption_queue).buf.data[(iVar3 + iVar8) % iVar2];
      puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar6 = *(ulong *)(puVar5 + uVar4);
      if ((uVar6 & 3) == 0) {
        *(ulong *)(puVar5 + uVar4) = uVar6 | 2;
      }
      iVar8 = iVar8 + 1;
    }
    uStack_38 = in_RAX;
    for (iVar8 = 0; uStack_38 = CONCAT44(iVar8,(undefined4)uStack_38), iVar8 < (this->touched).sz;
        iVar8 = iVar8 + 1) {
      if ((this->touched).data[iVar8] != '\0') {
        pvVar7 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::
                 lookup(&this->occurs,(int *)((long)&uStack_38 + 4));
        for (lVar9 = 0; lVar9 < pvVar7->sz; lVar9 = lVar9 + 1) {
          if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
               [pvVar7->data[lVar9]] & 3) == 0) {
            Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar7->data[lVar9]);
            puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            *(ulong *)(puVar5 + pvVar7->data[lVar9]) =
                 *(ulong *)(puVar5 + pvVar7->data[lVar9]) & 0xfffffffffffffffc | 2;
          }
        }
        (this->touched).data[uStack_38._4_4_] = '\0';
        iVar8 = uStack_38._4_4_;
      }
    }
    iVar8 = 0;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar2 = (this->subsumption_queue).buf.sz;
      iVar3 = (this->subsumption_queue).first;
      iVar10 = 0;
      if (iVar1 < iVar3) {
        iVar10 = iVar2;
      }
      if ((iVar1 - iVar3) + iVar10 <= iVar8) break;
      uVar4 = (this->subsumption_queue).buf.data[(iVar3 + iVar8) % iVar2];
      puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar6 = *(ulong *)(puVar5 + uVar4);
      if (((uint)uVar6 & 3) == 2) {
        *(ulong *)(puVar5 + uVar4) = uVar6 & 0xfffffffffffffffc;
      }
      iVar8 = iVar8 + 1;
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}